

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void __thiscall CConsole::DeregisterTemp(CConsole *this,char *pName)

{
  int iVar1;
  CCommand *pCVar2;
  CCommand **ppCVar3;
  
  pCVar2 = this->m_pFirstCommand;
  if (pCVar2 != (CCommand *)0x0) {
    ppCVar3 = &this->m_pFirstCommand;
    while ((pCVar2->m_Temp != true ||
           (iVar1 = str_comp((pCVar2->super_CCommandInfo).m_pName,pName), iVar1 != 0))) {
      pCVar2 = (*ppCVar3)->m_pNext;
      if (pCVar2 == (CCommand *)0x0) {
        return;
      }
      ppCVar3 = &(*ppCVar3)->m_pNext;
    }
    pCVar2 = *ppCVar3;
    *ppCVar3 = pCVar2->m_pNext;
    pCVar2->m_pNext = this->m_pRecycleList;
    this->m_pRecycleList = pCVar2;
  }
  return;
}

Assistant:

void CConsole::DeregisterTemp(const char *pName)
{
	if(!m_pFirstCommand)
		return;

	CCommand *pRemoved = 0;

	// remove temp entry from command list
	if(m_pFirstCommand->m_Temp && str_comp(m_pFirstCommand->m_pName, pName) == 0)
	{
		pRemoved = m_pFirstCommand;
		m_pFirstCommand = m_pFirstCommand->m_pNext;
	}
	else
	{
		for(CCommand *pCommand = m_pFirstCommand; pCommand->m_pNext; pCommand = pCommand->m_pNext)
			if(pCommand->m_pNext->m_Temp && str_comp(pCommand->m_pNext->m_pName, pName) == 0)
			{
				pRemoved = pCommand->m_pNext;
				pCommand->m_pNext = pCommand->m_pNext->m_pNext;
				break;
			}
	}

	// add to recycle list
	if(pRemoved)
	{
		pRemoved->m_pNext = m_pRecycleList;
		m_pRecycleList = pRemoved;
	}
}